

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

int __thiscall smf::MidiMessage::getControllerValue(MidiMessage *this)

{
  bool bVar1;
  int output;
  MidiMessage *this_local;
  
  bVar1 = isController(this);
  if (bVar1) {
    this_local._4_4_ = getP2(this);
    if (-1 < (int)this_local._4_4_) {
      this_local._4_4_ = this_local._4_4_ & 0x7f;
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int MidiMessage::getControllerValue(void) const {
	if (isController()) {
		int output = getP2();
		if (output < 0) {
			// -1 means no P2, although isController() is false in such a case.
			return output;
		} else {
			return 0x7f & output;
		}
	} else {
		return -1;
	}
}